

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_buffers.h
# Opt level: O3

shared_ptr<polyscope::render::TextureBuffer>
polyscope::render::
generateTextureBuffer<std::array<glm::vec<3,float,(glm::qualifier)0>,2ul>,(polyscope::DeviceBufferType)1>
          (Engine *engine)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<polyscope::render::TextureBuffer> sVar2;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"bad call","");
  exception(&local_38);
  _Var1._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
    _Var1._M_pi = extraout_RDX_00;
  }
  engine->_vptr_Engine = (_func_int **)0x0;
  (engine->groundPlane).groundPlaneProgram.
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  sVar2.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)engine;
  return (shared_ptr<polyscope::render::TextureBuffer>)
         sVar2.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextureBuffer> generateTextureBuffer(Engine* engine) {
  exception("bad call"); // default implementation, should be specialized to use
  return nullptr;
}